

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::setGroupingUsed(DecimalFormat *this,UBool enabled)

{
  UErrorCode localStatus;
  LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> LStack_18;
  
  LStack_18.ptr =
       (this->fields->properties).
       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if ((LStack_18.ptr)->groupingUsed != (bool)enabled) {
    NumberFormat::setGroupingUsed(&this->super_NumberFormat,enabled);
    ((this->fields->properties).
     super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->groupingUsed =
         enabled != '\0';
    LStack_18.ptr = LStack_18.ptr & 0xffffffff;
    touch(this,(UErrorCode *)((long)&LStack_18.ptr + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setGroupingUsed(UBool enabled) {
    if (UBOOL_TO_BOOL(enabled) == fields->properties->groupingUsed) { return; }
    NumberFormat::setGroupingUsed(enabled); // to set field for compatibility
    fields->properties->groupingUsed = enabled;
    touchNoError();
}